

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

ON_wString __thiscall
ON_ComponentManifest::UnusedName(ON_ComponentManifest *this,ON_ModelComponent *model_component)

{
  uchar auVar1 [8];
  wchar_t *candidate_name;
  Type TVar2;
  ON_UUID *pOVar3;
  wchar_t *base_name;
  ON_ModelComponent *in_RDX;
  ON_UUID component_parent_id;
  uint in_stack_ffffffffffffffbc;
  
  TVar2 = ON_ModelComponent::ComponentType(in_RDX);
  pOVar3 = ON_ModelComponent::ParentId(in_RDX);
  auVar1 = *(uchar (*) [8])pOVar3;
  candidate_name = *(wchar_t **)pOVar3->Data4;
  base_name = ON_ModelComponent::NameAsPointer(in_RDX);
  component_parent_id._1_7_ = 0;
  component_parent_id.Data1._0_1_ = TVar2;
  component_parent_id.Data4 = auVar1;
  UnusedName(this,(Type)model_component,component_parent_id,candidate_name,base_name,(wchar_t *)0x0,
             0,(uint *)((ulong)in_stack_ffffffffffffffbc << 0x20));
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ComponentManifest::UnusedName(
  const ON_ModelComponent& model_component
  ) const
{
  return UnusedName(
    model_component.ComponentType(),
    model_component.ParentId(),
    model_component.NameAsPointer(),
    nullptr,
    nullptr,
    0,
    nullptr
  );
}